

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O1

filepos_t EBML_ElementFullSize(ebml_element *Element,bool_t bWithDefault)

{
  uint8_t SizeLength;
  uint uVar1;
  byte bVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  if (bWithDefault == 0) {
    if (Element == (ebml_element *)0x0) {
      __assert_fail("(const void*)(Element)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                    ,0x7a,"filepos_t EBML_ElementFullSize(const ebml_element *, bool_t)");
    }
    lVar4 = (**(code **)((long)(Element->Base).Base.VMT + 0x88))(Element);
    if (lVar4 != 0) {
      return -1;
    }
  }
  lVar4 = Element->DataSize;
  uVar1 = Element->Context->Id;
  lVar5 = 1;
  if ((0xff < uVar1) && (lVar5 = 2, 0xffff < uVar1)) {
    lVar5 = 4 - (ulong)(uVar1 < 0x1000000);
  }
  SizeLength = Element->SizeLength;
  pvVar3 = Node_GetData((node *)Element,0x100,1);
  bVar2 = EBML_CodedSizeLength(lVar4,SizeLength,(ulong)(pvVar3 == (void *)0x0));
  return (ulong)bVar2 + lVar5 + lVar4;
}

Assistant:

filepos_t EBML_ElementFullSize(const ebml_element *Element, bool_t bWithDefault)
{
    if (!bWithDefault && EBML_ElementIsDefaultValue(Element))
        return INVALID_FILEPOS_T; // won't be saved
    return Element->DataSize + GetIdLength(Element->Context->Id) + EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
}